

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void celero::console::SetConsoleColor(ConsoleColor x)

{
  ConsoleColor x_local;
  
  switch(x) {
  case Default:
  default:
    Default();
    break;
  case Red:
    Red();
    break;
  case Red_Bold:
    RedBold();
    break;
  case Green:
    Green();
    break;
  case Green_Bold:
    GreenBold();
    break;
  case Blue:
    Blue();
    break;
  case Blue_Bold:
    BlueBold();
    break;
  case Cyan:
    Cyan();
    break;
  case Cyan_Bold:
    CyanBold();
    break;
  case Yellow:
    Yellow();
    break;
  case Yellow_Bold:
    YellowBold();
    break;
  case White:
    White();
    break;
  case White_Bold:
    WhiteBold();
    break;
  case WhiteOnRed:
    WhiteOnRed();
    break;
  case WhiteOnRed_Bold:
    WhiteOnRedBold();
    break;
  case Purple_Bold:
    PurpleBold();
  }
  return;
}

Assistant:

void celero::console::SetConsoleColor(const celero::console::ConsoleColor x)
{
	switch(x)
	{
		case console::ConsoleColor::Red:
			Red();
			break;
		case console::ConsoleColor::Red_Bold:
			RedBold();
			break;
		case console::ConsoleColor::Green:
			Green();
			break;
		case console::ConsoleColor::Green_Bold:
			GreenBold();
			break;
		case console::ConsoleColor::Blue:
			Blue();
			break;
		case console::ConsoleColor::Blue_Bold:
			BlueBold();
			break;
		case console::ConsoleColor::Cyan:
			Cyan();
			break;
		case console::ConsoleColor::Cyan_Bold:
			CyanBold();
			break;
		case console::ConsoleColor::Yellow:
			Yellow();
			break;
		case console::ConsoleColor::Yellow_Bold:
			YellowBold();
			break;
		case console::ConsoleColor::White:
			White();
			break;
		case console::ConsoleColor::White_Bold:
			WhiteBold();
			break;
		case console::ConsoleColor::WhiteOnRed:
			WhiteOnRed();
			break;
		case console::ConsoleColor::WhiteOnRed_Bold:
			WhiteOnRedBold();
			break;
		case console::ConsoleColor::Purple_Bold:
			PurpleBold();
			break;
		case console::ConsoleColor::Default:
		default:
			Default();
			break;
	}
}